

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape.c
# Opt level: O3

void read_shape(shape_t *record,int field_count,char **field_names,char **field_values)

{
  char *__s1;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  record->id[0] = '\0';
  record->pt_lat = (longdouble)0;
  record->pt_lon = (longdouble)0;
  record->pt_sequence = 0;
  record->dist_traveled = 0.0;
  if (0 < field_count) {
    uVar3 = 0;
    do {
      __s1 = field_names[uVar3];
      iVar1 = strcmp(__s1,"shape_id");
      if (iVar1 == 0) {
        strcpy(record->id,field_values[uVar3]);
      }
      else {
        iVar1 = strcmp(__s1,"shape_pt_lat");
        if (iVar1 == 0) {
          dVar4 = strtod(field_values[uVar3],(char **)0x0);
          record->pt_lat = (longdouble)dVar4;
        }
        else {
          iVar1 = strcmp(__s1,"shape_pt_lon");
          if (iVar1 == 0) {
            dVar4 = strtod(field_values[uVar3],(char **)0x0);
            record->pt_lon = (longdouble)dVar4;
          }
          else {
            iVar1 = strcmp(__s1,"shape_pt_sequence");
            if (iVar1 == 0) {
              uVar2 = strtoul(field_values[uVar3],(char **)0x0,0);
              record->pt_sequence = (uint)uVar2;
            }
            else {
              iVar1 = strcmp(__s1,"shape_dist_traveled");
              if (iVar1 == 0) {
                dVar4 = strtod(field_values[uVar3],(char **)0x0);
                record->dist_traveled = dVar4;
              }
            }
          }
        }
      }
      uVar3 = uVar3 + 1;
    } while ((uint)field_count != uVar3);
  }
  return;
}

Assistant:

void read_shape(shape_t *record, int field_count, const char **field_names, const char **field_values) {
    init_shape(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "shape_id") == 0) {
            strcpy(record->id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "shape_pt_lat") == 0) {
            record->pt_lat = strtod(field_values[i], NULL);  // TODO: strtold not working, figure out why
            continue;
        }
        if (strcmp(field_names[i], "shape_pt_lon") == 0) {
            record->pt_lon = strtod(field_values[i], NULL);  // TODO: same as record->c:26
            continue;
        }
        if (strcmp(field_names[i], "shape_pt_sequence") == 0) {
            record->pt_sequence = (unsigned int)strtoul(field_values[i], NULL, 0);
            continue;
        }
        if (strcmp(field_names[i], "shape_dist_traveled") == 0) {
            record->dist_traveled = strtod(field_values[i], NULL);
            continue;
        }
    }
}